

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O2

void __thiscall psy::C::SemanticModelTester::case0304(SemanticModelTester *this)

{
  SyntaxNode *this_00;
  bool bVar1;
  SyntaxKind SVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  TagDeclarationSymbol *this_01;
  TagType *pTVar5;
  Lexeme *pLVar6;
  undefined8 uVar7;
  ostream *poVar8;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [48];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "\nstruct x\n{\n    struct y\n    {\n        struct z { int _ ; } w;\n    } u ;\n} ;\n"
             ,&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_48 + 0x10),"",&local_6a);
  compile<psy::C::StructOrUnionDeclarationSyntax>
            ((SemanticModelTester *)local_48,(string *)this,&local_68);
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  std::__cxx11::string::~string((string *)&local_68);
  lVar4 = (**(code **)(**(long **)(((TestSuite *)(local_48._8_8_ + 0x28))->_vptr_TestSuite[7] + 8) +
                      0xe0))();
  lVar4 = (**(code **)(**(long **)(*(long *)(lVar4 + 0x28) + 8) + 0x1b0))();
  lVar4 = (**(code **)(**(long **)(*(long *)(*(long *)(*(long *)(lVar4 + 0x18) + 0x28) + 0x38) + 8)
                      + 0xe0))();
  lVar4 = (**(code **)(**(long **)(*(long *)(lVar4 + 0x28) + 8) + 0x1b0))();
  this_00 = *(SyntaxNode **)(lVar4 + 0x18);
  SVar2 = C::SyntaxNode::kind(this_00);
  if (SVar2 == StructDeclaration) {
    iVar3 = (*(this_00->super_Managed)._vptr_Managed[0xf])(this_00);
    this_01 = (TagDeclarationSymbol *)
              SemanticModel::structFor
                        ((SemanticModel *)local_48._0_8_,
                         (StructOrUnionDeclarationSyntax *)CONCAT44(extraout_var,iVar3));
    if (this_01 != (TagDeclarationSymbol *)0x0) {
      pTVar5 = TagDeclarationSymbol::introducedNewType(this_01);
      pLVar6 = &TagType::tag(pTVar5)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_68,pLVar6);
      bVar1 = std::operator==(&local_68,"z");
      std::__cxx11::string::~string((string *)&local_68);
      if (bVar1) {
        return;
      }
      poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
      pTVar5 = TagDeclarationSymbol::introducedNewType(this_01);
      pLVar6 = &TagType::tag(pTVar5)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_68,pLVar6);
      poVar8 = std::operator<<(poVar8,(string *)&local_68);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
      poVar8 = std::operator<<(poVar8,"z");
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\t");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x217);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_68);
      goto LAB_0038d293;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
    poVar8 = std::operator<<(poVar8,"true");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    iVar3 = 0x216;
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    SVar2 = C::SyntaxNode::kind(this_00);
    poVar8 = C::operator<<(poVar8,SVar2);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = C::operator<<(poVar8,StructDeclaration);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    iVar3 = 0x212;
  }
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar3);
  std::endl<char,std::char_traits<char>>(poVar8);
LAB_0038d293:
  uVar7 = __cxa_allocate_exception(1);
  __cxa_throw(uVar7,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0304()
{
    auto [tyDeclNode, semaModel] =
            compile<StructOrUnionDeclarationSyntax>(R"(
struct x
{
    struct y
    {
        struct z { int _ ; } w;
    } u ;
} ;
)");

    auto tySpec = tyDeclNode->typeSpecifier();
    auto fldDecl0 = tySpec->declarations()->value->asFieldDeclaration();
    auto nestedtyDeclNode = fldDecl0->specifiers()->value->asTagDeclarationAsSpecifier()->tagDeclaration();

    auto nestedTySpec = nestedtyDeclNode->typeSpecifier();
    auto nestedFldDecl0 = nestedTySpec->declarations()->value->asFieldDeclaration();
    auto nestedNestedtyDeclNode = nestedFldDecl0->specifiers()->value->asTagDeclarationAsSpecifier()->tagDeclaration();
    PSY_EXPECT_EQ_ENU(nestedNestedtyDeclNode->kind(),
                      SyntaxKind::StructDeclaration,
                      SyntaxKind);

    const StructDeclarationSymbol* strukt =
            semaModel->structFor(nestedNestedtyDeclNode->asStructOrUnionDeclaration());
    PSY_EXPECT_TRUE(strukt);
    PSY_EXPECT_EQ_STR(strukt->introducedNewType()->tag()->valueText(), "z");
}